

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::clear_all(timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
            *this)

{
  reference_counter_type *prVar1;
  pointer pwVar2;
  timer_type *ptVar3;
  timer_type *ptVar4;
  long lVar5;
  wheel_item *item;
  pointer pwVar6;
  
  pwVar2 = (this->m_wheel).
           super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar6 = (this->m_wheel).
                super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar6 != pwVar2; pwVar6 = pwVar6 + 1) {
    ptVar3 = pwVar6->m_head;
    pwVar6->m_head = (timer_type *)0x0;
    pwVar6->m_tail = (timer_type *)0x0;
    while (ptVar4 = ptVar3, ptVar4 != (timer_type *)0x0) {
      ptVar3 = ptVar4->m_next;
      *(undefined4 *)&(ptVar4->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
      prVar1 = &(ptVar4->super_timer_object<timertt::thread_safety::unsafe>).m_references;
      *prVar1 = *prVar1 - 1;
      if (*prVar1 == 0) {
        (*(ptVar4->super_timer_object<timertt::thread_safety::unsafe>)._vptr_timer_object[1])();
      }
    }
  }
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_single_shot_count = 0;
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_periodic_count = 0;
  lVar5 = std::chrono::_V2::steady_clock::now();
  (this->m_current_tick_border).__d.__r = lVar5 + (this->m_granularity).__r;
  this->m_current_position = 0;
  return;
}

Assistant:

void
	clear_all()
	{
		for( auto & item : m_wheel )
		{
			timer_type * timer = item.m_head;
			item = wheel_item();

			while( timer )
			{
				timer_type * t = timer;
				timer = timer->m_next;

				t->m_status = timer_status::deactivated;
				timer_object< THREAD_SAFETY >::decrement_references( t );
			}
		}

		// For the case of timer_engine restart.
		this->reset_timer_count();
		this->m_current_tick_border = monotonic_clock::now() + m_granularity;
		this->m_current_position = 0;
	}